

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O2

void __thiscall
Assimp::OptimizeGraphProcess::CollectNewChildren
          (OptimizeGraphProcess *this,aiNode *nd,list<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  LockedSetType *this_00;
  _Rb_tree_header *p_Var1;
  aiMatrix4x4 *this_01;
  uint uVar2;
  aiMesh *pMesh;
  aiNode *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  bool bVar21;
  int iVar22;
  aiNode **tmp;
  iterator iVar23;
  iterator iVar24;
  _List_node_base *p_Var25;
  iterator iVar26;
  aiMatrix3x3t<float> *paVar27;
  aiNode **ppaVar28;
  uint i;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  value_type paVar33;
  _List_node_base *p_Var34;
  OptimizeGraphProcess *pOVar35;
  float fVar36;
  list<aiNode_*,_std::allocator<aiNode_*>_> child_nodes;
  aiMatrix4x4 inv;
  list<aiNode_*,_std::allocator<aiNode_*>_> join;
  aiMatrix4x4t<float> temp;
  aiNode *child;
  aiNode *local_160;
  _List_node_base *local_158;
  allocator<char> local_149;
  _List_base<aiNode_*,_std::allocator<aiNode_*>_> local_148;
  OptimizeGraphProcess *local_130;
  value_type local_128;
  int local_11c;
  undefined1 local_118 [32];
  undefined8 uStack_f8;
  float local_f0;
  float local_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float local_dc;
  _List_base<aiNode_*,_std::allocator<aiNode_*>_> local_d0;
  aiMatrix4x4t<float> local_b8;
  _List_node_base *local_70;
  _List_node_base *local_68;
  aiNode *local_60;
  aiMatrix3x3t<float> local_58;
  
  this->nodes_in = this->nodes_in + nd->mNumChildren;
  local_148._M_impl._M_node._M_size = 0;
  local_160 = nd;
  local_158 = (_List_node_base *)nodes;
  local_148._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_148;
  local_148._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_148;
  for (uVar29 = 0; uVar29 < local_160->mNumChildren; uVar29 = uVar29 + 1) {
    CollectNewChildren(this,local_160->mChildren[uVar29],
                       (list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_148);
    local_160->mChildren[uVar29] = (aiNode *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,(local_160->mName).data,(allocator<char> *)&local_b8);
  this_00 = &this->locked;
  iVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_118);
  p_Var1 = &(this->locked)._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)local_118);
  local_130 = this;
  if ((_Rb_tree_header *)iVar23._M_node != p_Var1) {
    std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
              ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_158,&local_160);
    local_118._0_4_ = 1.0;
    local_118._4_4_ = 0.0;
    local_118._8_4_ = 0.0;
    local_118._12_4_ = 0.0;
    local_118._16_4_ = 0.0;
    local_118._20_4_ = 1.0;
    local_118._24_4_ = 0.0;
    local_118._28_4_ = 0.0;
    uStack_f8._0_4_ = 0.0;
    uStack_f8._4_4_ = 0.0;
    local_f0 = 1.0;
    local_ec = 0.0;
    fStack_e8 = 0.0;
    fStack_e4 = 0.0;
    fStack_e0 = 0.0;
    local_dc = 1.0;
    local_d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d0;
    local_d0._M_impl._M_node._M_size = 0;
    paVar33 = (value_type)0x0;
    iVar24._M_node = local_148._M_impl._M_node.super__List_node_base._M_next;
    local_d0._M_impl._M_node.super__List_node_base._M_prev =
         local_d0._M_impl._M_node.super__List_node_base._M_next;
LAB_003be26a:
    do {
      pOVar35 = local_130;
      if (iVar24._M_node == (_List_node_base *)&local_148) goto LAB_003be406;
      local_58._0_8_ = iVar24._M_node[1]._M_next;
      if (*(int *)&((_List_node_base *)&((value_type)local_58._0_8_)->mNumChildren)->_M_next == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,(((value_type)local_58._0_8_)->mName).data,&local_149);
        iVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&this_00->_M_t,(key_type *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        uVar20 = local_58._0_8_;
        if ((_Rb_tree_header *)iVar23._M_node == p_Var1) {
          uVar2 = *(uint *)&((_List_node_base *)(local_58._0_8_ + 0x460))->_M_next;
          for (uVar29 = 0; uVar2 != uVar29; uVar29 = uVar29 + 1) {
            if (1 < (local_130->meshes).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [*(uint *)((long)&((_List_node_base *)(local_58._0_8_ + 0x468))->_M_next->
                                      _M_next + uVar29 * 4)]) {
              if (uVar2 != (uint)uVar29) goto LAB_003be2bf;
              break;
            }
          }
          if (paVar33 != (value_type)0x0) {
            local_b8.a2 = (float)local_118._4_4_;
            local_b8.a1 = (float)local_118._0_4_;
            local_b8.a4 = (float)local_118._12_4_;
            local_b8.a3 = (float)local_118._8_4_;
            local_b8.b2 = (float)local_118._20_4_;
            local_b8.b1 = (float)local_118._16_4_;
            local_b8.c4 = local_ec;
            local_b8.c3 = local_f0;
            local_b8.d2 = fStack_e4;
            local_b8.d1 = fStack_e8;
            local_b8.d4 = local_dc;
            local_b8.d3 = fStack_e0;
            local_b8.c1 = (float)uStack_f8;
            local_b8.c2 = uStack_f8._4_4_;
            local_b8.b3 = (float)local_118._24_4_;
            local_b8.b4 = (float)local_118._28_4_;
            aiMatrix4x4t<float>::operator*=
                      (&local_b8,(aiMatrix4x4t<float> *)(local_58._0_8_ + 0x404));
            *(undefined8 *)
             ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_next + 4) =
                 local_b8._48_8_;
            *(undefined8 *)
             ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_prev + 4) =
                 local_b8._56_8_;
            *(undefined8 *)
             ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_next + 4) =
                 local_b8._32_8_;
            *(undefined8 *)
             ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_prev + 4) =
                 local_b8._40_8_;
            *(float *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_next + 4) =
                 local_b8.b1;
            *(float *)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_prev = local_b8.b2;
            *(float *)((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_prev + 4) =
                 local_b8.b3;
            *(float *)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_next = local_b8.b4;
            *(undefined8 *)(local_58._0_8_ + 0x404) = local_b8._0_8_;
            *(undefined8 *)&((aiMatrix4x4 *)(local_58._0_8_ + 0x404))->a3 = local_b8._8_8_;
            std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                      ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_d0,
                       (value_type *)&local_58);
            iVar24 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                               ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_148,
                                iVar24._M_node);
            goto LAB_003be26a;
          }
          uVar4 = *(undefined8 *)&((aiMatrix4x4 *)(local_58._0_8_ + 0x404))->a3;
          local_118._16_4_ =
               *(undefined4 *)
                ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_next + 4);
          local_118._20_4_ =
               *(undefined4 *)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_prev;
          local_118._24_8_ =
               *(undefined8 *)
                ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0xc))->_M_prev + 4);
          uStack_f8 = *(undefined8 *)
                       ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_next + 4);
          uVar5 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x1c))->_M_prev + 4);
          uVar6 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_next + 4);
          uVar7 = *(undefined8 *)
                   ((long)&((_List_node_base *)(local_58._0_8_ + 0x404 + 0x2c))->_M_prev + 4);
          fStack_e8 = (float)uVar6;
          fStack_e4 = (float)((ulong)uVar6 >> 0x20);
          fStack_e0 = (float)uVar7;
          local_dc = (float)((ulong)uVar7 >> 0x20);
          local_f0 = (float)uVar5;
          local_ec = (float)((ulong)uVar5 >> 0x20);
          local_118._0_4_ = (undefined4)*(undefined8 *)(local_58._0_8_ + 0x404);
          local_118._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_58._0_8_ + 0x404) >> 0x20);
          local_118._8_4_ = (undefined4)uVar4;
          local_118._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_118);
          paVar33 = (value_type)uVar20;
        }
      }
LAB_003be2bf:
      iVar24._M_node = (iVar24._M_node)->_M_next;
    } while( true );
  }
  iVar24._M_node = local_148._M_impl._M_node.super__List_node_base._M_next;
  while (paVar3 = local_160, iVar24._M_node != (_List_node_base *)&local_148) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,(char *)((long)&(iVar24._M_node[1]._M_next)->_M_next + 4),
               (allocator<char> *)&local_b8);
    iVar26 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this_00->_M_t,(key_type *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    if (iVar26._M_node == iVar23._M_node) {
      p_Var25 = iVar24._M_node + 1;
      uVar8 = (local_160->mTransformation).a1;
      uVar9 = (local_160->mTransformation).a2;
      uVar10 = (local_160->mTransformation).a3;
      uVar11 = (local_160->mTransformation).a4;
      uVar12 = (local_160->mTransformation).b1;
      uVar13 = (local_160->mTransformation).b2;
      local_118._24_4_ = (local_160->mTransformation).b3;
      local_118._28_4_ = (local_160->mTransformation).b4;
      uStack_f8._0_4_ = (local_160->mTransformation).c1;
      uStack_f8._4_4_ = (local_160->mTransformation).c2;
      uVar14 = (local_160->mTransformation).c3;
      uVar15 = (local_160->mTransformation).c4;
      uVar16 = (local_160->mTransformation).d1;
      uVar17 = (local_160->mTransformation).d2;
      uVar18 = (local_160->mTransformation).d3;
      uVar19 = (local_160->mTransformation).d4;
      local_118._0_4_ = uVar8;
      local_118._4_4_ = uVar9;
      local_118._8_4_ = uVar10;
      local_118._12_4_ = uVar11;
      local_118._16_4_ = uVar12;
      local_118._20_4_ = uVar13;
      local_f0 = (float)uVar14;
      local_ec = (float)uVar15;
      fStack_e8 = (float)uVar16;
      fStack_e4 = (float)uVar17;
      fStack_e0 = (float)uVar18;
      local_dc = (float)uVar19;
      aiMatrix4x4t<float>::operator*=
                ((aiMatrix4x4t<float> *)local_118,&((value_type)p_Var25->_M_next)->mTransformation);
      paVar33 = (value_type)p_Var25->_M_next;
      (paVar33->mTransformation).d1 = fStack_e8;
      (paVar33->mTransformation).d2 = fStack_e4;
      (paVar33->mTransformation).d3 = fStack_e0;
      (paVar33->mTransformation).d4 = local_dc;
      (paVar33->mTransformation).c1 = (float)uStack_f8;
      (paVar33->mTransformation).c2 = uStack_f8._4_4_;
      (paVar33->mTransformation).c3 = local_f0;
      (paVar33->mTransformation).c4 = local_ec;
      (paVar33->mTransformation).b1 = (float)local_118._16_4_;
      (paVar33->mTransformation).b2 = (float)local_118._20_4_;
      (paVar33->mTransformation).b3 = (float)local_118._24_4_;
      (paVar33->mTransformation).b4 = (float)local_118._28_4_;
      (paVar33->mTransformation).a1 = (float)local_118._0_4_;
      (paVar33->mTransformation).a2 = (float)local_118._4_4_;
      (paVar33->mTransformation).a3 = (float)local_118._8_4_;
      (paVar33->mTransformation).a4 = (float)local_118._12_4_;
      std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_158,(value_type *)p_Var25);
      iVar24 = std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::erase
                         ((list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_148,iVar24._M_node);
    }
    else {
      iVar24._M_node = (iVar24._M_node)->_M_next;
    }
  }
  if ((local_160->mNumMeshes == 0) &&
     (local_148._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_148)) {
    aiNode::~aiNode(local_160);
    operator_delete(paVar3,0x478);
    goto LAB_003be8b7;
  }
  std::__cxx11::list<aiNode_*,_std::allocator<aiNode_*>_>::push_back
            ((list<aiNode_*,_std::allocator<aiNode_*>_> *)local_158,&local_160);
  pOVar35 = local_130;
LAB_003be7f0:
  if ((local_148._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_148) ||
     (local_160->mNumChildren < local_148._M_impl._M_node._M_size)) {
    if (local_160->mChildren != (aiNode **)0x0) {
      operator_delete__(local_160->mChildren);
    }
    p_Var25 = local_148._M_impl._M_node.super__List_node_base._M_next;
    uVar2 = (uint)local_148._M_impl._M_node._M_size;
    if (local_148._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_148) {
      ppaVar28 = (aiNode **)
                 operator_new__(-(ulong)(local_148._M_impl._M_node._M_size >> 0x3d != 0) |
                                local_148._M_impl._M_node._M_size * 8);
      local_160->mChildren = ppaVar28;
      local_160->mNumChildren = uVar2;
      goto LAB_003be891;
    }
    local_160->mChildren = (aiNode **)0x0;
    local_160->mNumChildren = (uint)local_148._M_impl._M_node._M_size;
    uVar29 = local_148._M_impl._M_node._M_size & 0xffffffff;
  }
  else {
    ppaVar28 = local_160->mChildren;
    local_160->mNumChildren = (uint)local_148._M_impl._M_node._M_size;
    uVar29 = local_148._M_impl._M_node._M_size;
    p_Var25 = local_148._M_impl._M_node.super__List_node_base._M_next;
    if (ppaVar28 != (aiNode **)0x0) {
LAB_003be891:
      for (; p_Var25 != (_List_node_base *)&local_148;
          p_Var25 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var25->_M_next)->_M_impl
                    )._M_node.super__List_node_base._M_next) {
        paVar3 = (aiNode *)p_Var25[1]._M_next;
        *ppaVar28 = paVar3;
        ppaVar28 = ppaVar28 + 1;
        paVar3->mParent = local_160;
      }
      uVar29 = local_148._M_impl._M_node._M_size & 0xffffffff;
    }
  }
  pOVar35->nodes_out = pOVar35->nodes_out + (int)uVar29;
LAB_003be8b7:
  std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear(&local_148);
  return;
LAB_003be406:
  if ((paVar33 != (value_type)0x0) &&
     (local_d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_d0)) {
    local_130->count_merged = local_130->count_merged + 1;
    iVar31 = 0;
    local_128 = paVar33;
    iVar22 = snprintf((paVar33->mName).data,0x400,"$MergedNode_%i");
    p_Var34 = local_d0._M_impl._M_node.super__List_node_base._M_next;
    (local_128->mName).length = iVar22;
    for (p_Var25 = local_d0._M_impl._M_node.super__List_node_base._M_next;
        p_Var25 != (_List_node_base *)&local_d0;
        p_Var25 = (((_List_impl *)&p_Var25->_M_next)->_M_node).super__List_node_base._M_next) {
      iVar31 = iVar31 + *(int *)(*(size_t *)(p_Var25 + 1) + 0x460);
    }
    if (iVar31 != 0) {
      local_70 = (_List_node_base *)
                 operator_new__((ulong)(uint)(*(int *)&((_List_node_base *)&local_128->mNumMeshes)->
                                                       _M_next + iVar31) << 2);
      local_158 = local_70;
      for (uVar29 = 0; uVar29 < *(uint *)&((_List_node_base *)&local_128->mNumMeshes)->_M_next;
          uVar29 = uVar29 + 1) {
        *(undefined4 *)&local_158->_M_next =
             *(undefined4 *)
              ((long)&((_List_node_base *)&local_128->mMeshes)->_M_next->_M_next + uVar29 * 4);
        local_158 = (_List_node_base *)((long)&local_158->_M_next + 4);
      }
      local_11c = iVar31;
      while (p_Var34 != (_List_node_base *)&local_d0) {
        local_60 = (aiNode *)p_Var34[1]._M_next;
        this_01 = &local_60->mTransformation;
        local_68 = p_Var34;
        for (uVar29 = 0; paVar3 = local_60, p_Var25 = local_158, uVar29 < local_60->mNumMeshes;
            uVar29 = uVar29 + 1) {
          uVar2 = local_60->mMeshes[uVar29];
          *(uint *)&local_158->_M_next = uVar2;
          pMesh = local_130->mScene->mMeshes[uVar2];
          fVar36 = aiMatrix4x4t<float>::Determinant(this_01);
          if (fVar36 < 0.0) {
            FlipWindingOrderProcess::ProcessMesh(pMesh);
          }
          aiMatrix3x3t<float>::aiMatrix3x3t(&local_58,this_01);
          paVar27 = aiMatrix3x3t<float>::Inverse(&local_58);
          local_158 = (_List_node_base *)((long)&p_Var25->_M_next + 4);
          paVar27 = aiMatrix3x3t<float>::Transpose(paVar27);
          local_b8.a1 = paVar27->a1;
          local_b8.a2 = paVar27->a2;
          local_b8.a3 = paVar27->a3;
          local_b8.a4 = paVar27->b1;
          local_b8.b1 = paVar27->b2;
          local_b8.b2 = paVar27->b3;
          local_b8.b3 = paVar27->c1;
          local_b8.b4 = paVar27->c2;
          local_b8.c1 = paVar27->c3;
          lVar32 = 0;
          for (uVar30 = 0; uVar30 < pMesh->mNumVertices; uVar30 = uVar30 + 1) {
            aiVector3t<float>::operator*=
                      ((aiVector3t<float> *)((long)&pMesh->mVertices->x + lVar32),this_01);
            if ((pMesh->mNormals != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)((long)&pMesh->mNormals->x + lVar32),
                         (aiMatrix3x3t<float> *)&local_b8);
            }
            bVar21 = aiMesh::HasTangentsAndBitangents(pMesh);
            if (bVar21) {
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)((long)&pMesh->mTangents->x + lVar32),
                         (aiMatrix3x3t<float> *)&local_b8);
              aiVector3t<float>::operator*=
                        ((aiVector3t<float> *)((long)&pMesh->mBitangents->x + lVar32),
                         (aiMatrix3x3t<float> *)&local_b8);
            }
            lVar32 = lVar32 + 0xc;
          }
        }
        aiNode::~aiNode(local_60);
        operator_delete(paVar3,0x478);
        pOVar35 = local_130;
        p_Var34 = local_68->_M_next;
      }
      p_Var25 = ((_List_node_base *)&local_128->mMeshes)->_M_next;
      if (p_Var25 != (_List_node_base *)0x0) {
        operator_delete__(p_Var25);
      }
      ((_List_node_base *)&local_128->mMeshes)->_M_next = local_70;
      *(int *)&((_List_node_base *)&local_128->mNumMeshes)->_M_next =
           *(int *)&((_List_node_base *)&local_128->mNumMeshes)->_M_next + local_11c;
    }
  }
  std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear(&local_d0);
  goto LAB_003be7f0;
}

Assistant:

void OptimizeGraphProcess::CollectNewChildren(aiNode *nd, std::list<aiNode *> &nodes) {
	nodes_in += nd->mNumChildren;

	// Process children
	std::list<aiNode *> child_nodes;
	for (unsigned int i = 0; i < nd->mNumChildren; ++i) {
		CollectNewChildren(nd->mChildren[i], child_nodes);
		nd->mChildren[i] = nullptr;
	}

	// Check whether we need this node; if not we can replace it by our own children (warn, danger of incest).
	if (locked.find(AI_OG_GETKEY(nd->mName)) == locked.end()) {
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {

			if (locked.find(AI_OG_GETKEY((*it)->mName)) == locked.end()) {
				(*it)->mTransformation = nd->mTransformation * (*it)->mTransformation;
				nodes.push_back(*it);

				it = child_nodes.erase(it);
				continue;
			}
			++it;
		}

		if (nd->mNumMeshes || !child_nodes.empty()) {
			nodes.push_back(nd);
		} else {
			delete nd; /* bye, node */
			return;
		}
	} else {

		// Retain our current position in the hierarchy
		nodes.push_back(nd);

		// Now check for possible optimizations in our list of child nodes. join as many as possible
		aiNode *join_master = nullptr;
		aiMatrix4x4 inv;

		const LockedSetType::const_iterator end = locked.end();

		std::list<aiNode *> join;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end();) {
			aiNode *child = *it;
			if (child->mNumChildren == 0 && locked.find(AI_OG_GETKEY(child->mName)) == end) {

				// There may be no instanced meshes
				unsigned int n = 0;
				for (; n < child->mNumMeshes; ++n) {
					if (meshes[child->mMeshes[n]] > 1) {
						break;
					}
				}
				if (n == child->mNumMeshes) {
					if (!join_master) {
						join_master = child;
						inv = join_master->mTransformation;
						inv.Inverse();
					} else {
						child->mTransformation = inv * child->mTransformation;

						join.push_back(child);
						it = child_nodes.erase(it);
						continue;
					}
				}
			}
			++it;
		}
		if (join_master && !join.empty()) {
			join_master->mName.length = ::ai_snprintf(join_master->mName.data, MAXLEN, "$MergedNode_%i", count_merged++);

			unsigned int out_meshes = 0;
			for (std::list<aiNode *>::const_iterator it = join.cbegin(); it != join.cend(); ++it) {
				out_meshes += (*it)->mNumMeshes;
			}

			// copy all mesh references in one array
			if (out_meshes) {
				unsigned int *meshes = new unsigned int[out_meshes + join_master->mNumMeshes], *tmp = meshes;
				for (unsigned int n = 0; n < join_master->mNumMeshes; ++n) {
					*tmp++ = join_master->mMeshes[n];
				}

				for (const aiNode *join_node : join) {
					for (unsigned int n = 0; n < join_node->mNumMeshes; ++n) {

						*tmp = join_node->mMeshes[n];
						aiMesh *mesh = mScene->mMeshes[*tmp++];

						// Assume the transformation is affine
						// manually move the mesh into the right coordinate system

						// Check for odd negative scale (mirror)
						if (join_node->mTransformation.Determinant() < 0) {
							// Reverse the mesh face winding order
                            FlipWindingOrderProcess::ProcessMesh(mesh);
						}

                        // Update positions, normals and tangents
						const aiMatrix3x3 IT = aiMatrix3x3(join_node->mTransformation).Inverse().Transpose();
						for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {

							mesh->mVertices[a] *= join_node->mTransformation;

							if (mesh->HasNormals())
								mesh->mNormals[a] *= IT;

							if (mesh->HasTangentsAndBitangents()) {
								mesh->mTangents[a] *= IT;
								mesh->mBitangents[a] *= IT;
							}
						}
					}
					delete join_node; // bye, node
				}
				delete[] join_master->mMeshes;
				join_master->mMeshes = meshes;
				join_master->mNumMeshes += out_meshes;
			}
		}
	}
	// reassign children if something changed
	if (child_nodes.empty() || child_nodes.size() > nd->mNumChildren) {

		delete[] nd->mChildren;

		if (!child_nodes.empty()) {
			nd->mChildren = new aiNode *[child_nodes.size()];
		} else
			nd->mChildren = nullptr;
	}

	nd->mNumChildren = static_cast<unsigned int>(child_nodes.size());

	if (nd->mChildren) {
		aiNode **tmp = nd->mChildren;
		for (std::list<aiNode *>::iterator it = child_nodes.begin(); it != child_nodes.end(); ++it) {
			aiNode *node = *tmp++ = *it;
			node->mParent = nd;
		}
	}

	nodes_out += static_cast<unsigned int>(child_nodes.size());
}